

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereIndexExprTransNode(Walker *p,Expr *pExpr)

{
  IdxExprTrans *pIVar1;
  int iVar2;
  IdxExprTrans *pX;
  Expr *pExpr_local;
  Walker *p_local;
  
  pIVar1 = (p->u).pIdxTrans;
  iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar1->pIdxExpr,pIVar1->iTabCur);
  if (iVar2 == 0) {
    pExpr->op = 0x9e;
    pExpr->iTable = pIVar1->iIdxCur;
    pExpr->iColumn = (ynVar)pIVar1->iIdxCol;
    (pExpr->y).pTab = (Table *)0x0;
  }
  p_local._4_4_ = (uint)(iVar2 == 0);
  return p_local._4_4_;
}

Assistant:

static int whereIndexExprTransNode(Walker *p, Expr *pExpr){
  IdxExprTrans *pX = p->u.pIdxTrans;
  if( sqlite3ExprCompare(0, pExpr, pX->pIdxExpr, pX->iTabCur)==0 ){
    pExpr->op = TK_COLUMN;
    pExpr->iTable = pX->iIdxCur;
    pExpr->iColumn = pX->iIdxCol;
    pExpr->y.pTab = 0;
    return WRC_Prune;
  }else{
    return WRC_Continue;
  }
}